

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O0

void __thiscall
Disa::Vector_Dense<double,_0UL>::Vector_Dense
          (Vector_Dense<double,_0UL> *this,initializer_list<double> *list)

{
  double dVar1;
  size_type __new_size;
  reference pdVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  const_iterator local_50;
  double *item;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<double> *__range2;
  iterator iter;
  initializer_list<double> *list_local;
  Vector_Dense<double,_0UL> *this_local;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&this->super_vector<double,_std::allocator<double>_>);
  __new_size = std::initializer_list<double>::size(list);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->super_vector<double,_std::allocator<double>_>,__new_size);
  __range2 = (initializer_list<double> *)
             std::vector<double,_std::allocator<double>_>::begin
                       (&this->super_vector<double,_std::allocator<double>_>);
  __begin0 = (const_iterator)list;
  __end0 = std::initializer_list<double>::begin(list);
  item = std::initializer_list<double>::end((initializer_list<double> *)__begin0);
  for (; __end0 != item; __end0 = __end0 + 1) {
    local_50 = __end0;
    dVar1 = *__end0;
    local_58 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator++((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)&__range2,0);
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_58);
    *pdVar2 = dVar1;
  }
  return;
}

Assistant:

Vector_Dense(const std::initializer_list<_type>& list) {
    this->resize(list.size());
    auto iter = this->begin();
    FOR_EACH(item, list)* iter++ = item;
  }